

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

precise_unit units::checkMultiplierCharacter(string *unit_string,uint64_t match_flags,char mchar)

{
  char cVar1;
  undefined1 *puVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  undefined7 in_register_00000011;
  precise_unit pVar7;
  precise_unit pVar8;
  string ustring;
  undefined1 *local_90;
  size_t local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  string local_70;
  string local_50;
  
  local_90 = &local_80;
  local_88 = 0;
  local_80 = 0;
  uVar5 = std::__cxx11::string::find
                    ((char)unit_string,CONCAT71(in_register_00000011,mchar) & 0xffffffff);
  if (uVar5 != 0xffffffffffffffff) {
    lVar6 = std::__cxx11::string::find((char)unit_string,(ulong)(uint)(int)mchar);
    if (lVar6 == -1) {
      std::__cxx11::string::_M_assign((string *)&local_90);
      std::__cxx11::string::erase((ulong)&local_90,uVar5);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_90,local_90 + local_88);
      pVar7 = unit_quick_match(&local_70,match_flags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((pVar7._8_8_ & 0xffffffff) != 0xfa94a488 && !NAN(pVar7.multiplier_)) goto LAB_0016db70;
    }
    std::__cxx11::string::_M_assign((string *)&local_90);
    do {
      if (uVar5 == local_88 - 1) {
        std::__cxx11::string::erase((ulong)&local_90,uVar5);
      }
      else {
        cVar1 = local_90[uVar5 + 1];
        if ((byte)(cVar1 - 0x30U) < 10) {
          if ((uVar5 != 0) && (local_90[uVar5 - 1] != '^')) {
            std::__cxx11::string::insert((ulong)&local_90,uVar5,'\x01');
          }
        }
        else {
          if (cVar1 == mchar) goto LAB_0016db6a;
          if ((cVar1 != '(') && (cVar1 != '[')) {
            local_90[uVar5] = 0x2a;
          }
        }
      }
      uVar5 = std::__cxx11::string::find((char)&local_90,(ulong)(uint)(int)mchar);
      sVar3 = local_88;
      puVar2 = local_90;
    } while (uVar5 != 0xffffffffffffffff);
    if ((local_88 != unit_string->_M_string_length) ||
       ((local_88 != 0 &&
        (iVar4 = bcmp(local_90,(unit_string->_M_dataplus)._M_p,local_88), iVar4 != 0)))) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,puVar2,puVar2 + sVar3);
      pVar8 = unit_from_string_internal(&local_50,match_flags | 0x400000000);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pVar7.base_units_ = (unit_data)0xfa94a488;
      pVar7.commodity_ = 0;
      pVar7.multiplier_ = NAN;
      if ((pVar8._8_8_ & 0xffffffff) != 0xfa94a488 && !NAN(pVar8.multiplier_)) {
        pVar7 = pVar8;
      }
      goto LAB_0016db70;
    }
  }
LAB_0016db6a:
  pVar7.base_units_ = (unit_data)0xfa94a488;
  pVar7.commodity_ = 0;
  pVar7.multiplier_ = NAN;
LAB_0016db70:
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  return pVar7;
}

Assistant:

static precise_unit checkMultiplierCharacter(
    const std::string& unit_string,
    std::uint64_t match_flags,
    char mchar)
{
    // assume mchar means multiply
    std::string ustring;
    precise_unit retunit;
    auto fd = unit_string.find_first_of(mchar);
    if (fd != std::string::npos) {
        // if there is a single one just check for a merged unit
        if (unit_string.find_first_of(mchar, fd + 1) == std::string::npos) {
            ustring = unit_string;
            ustring.erase(fd, 1);
            retunit = unit_quick_match(ustring, match_flags);
            if (!is_error(retunit)) {
                return retunit;
            }
        }
        ustring = unit_string;
        while (fd != std::string::npos) {
            if (fd == ustring.size() - 1) {
                ustring.erase(fd, 1);
            } else if (isDigitCharacter(ustring[fd + 1])) {
                if (fd > 0 && ustring[fd - 1] != '^') {
                    ustring.insert(fd, 1, '^');
                    fd += 1;
                }
            } else if (ustring[fd + 1] == mchar) {
                // repeated characters,  cannot mean separator
                return precise::invalid;
            } else if (ustring[fd + 1] != '[' && ustring[fd + 1] != '(') {
                ustring[fd] = '*';
            }
            // ignore adjacent ones
            fd = ustring.find_first_of(mchar, fd + 2);
        }
        if (ustring != unit_string) {
            retunit = unit_from_string_internal(
                ustring, match_flags | skip_partition_check);
            if (!is_error(retunit)) {
                return retunit;
            }
        }
    }
    return precise::invalid;
}